

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O2

bool __thiscall wasm::anon_unknown_0::TypeMerging::merge(TypeMerging *this,MergeKind kind)

{
  TypeMerging *pTVar1;
  __node_base_ptr p_Var2;
  __node_base_ptr *pp_Var3;
  __node_base_ptr *this_00;
  TypeMerging **this_01;
  _Hash_node_base _Var4;
  _Hash_node_base *p_Var5;
  __buckets_ptr pp_Var6;
  pointer pHVar7;
  __buckets_ptr pp_Var8;
  pointer pvVar9;
  bool bVar10;
  bool bVar11;
  HeapTypeKind HVar12;
  TypeMerging *pTVar13;
  size_type sVar14;
  size_t sVar15;
  _Hash_node_base *p_Var16;
  _Hash_node_base *p_Var17;
  size_t *__s;
  size_t *psVar18;
  iterator iVar19;
  mapped_type *pmVar20;
  TypeMerging *pTVar21;
  Struct *pSVar22;
  pointer pFVar23;
  size_t sVar24;
  _Hash_node_base *p_Var25;
  __node_base_ptr p_Var26;
  mapped_type *pmVar27;
  long lVar28;
  mapped_type *pmVar29;
  _Hash_node_base _Var30;
  pointer pFVar31;
  undefined1 auVar32 [8];
  uint uVar33;
  ulong uVar34;
  __buckets_ptr __n;
  ulong extraout_RDX;
  size_t i;
  __node_base_ptr p_Var35;
  _Hash_node_base *p_Var36;
  ulong uVar37;
  char *msg;
  __buckets_ptr pp_Var38;
  _Hash_node_base *p_Var39;
  optional<wasm::HeapType> oVar40;
  undefined1 auVar41 [16];
  Signature SVar42;
  Array AVar43;
  Field a;
  Field a_00;
  initializer_list<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_> __l;
  initializer_list<wasm::HeapType> __l_00;
  undefined1 local_260 [8];
  unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
  typePartitions;
  optional<wasm::HeapType> super_1;
  undefined1 local_210 [8];
  Partitions partitions;
  undefined1 local_1e0 [8];
  anon_class_24_3_64d2c6ff ensurePartition;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  partitionIndices;
  HeapType type_1;
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  newPartitions;
  vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  dfa;
  undefined1 local_150 [8];
  unordered_map<std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>,_std::hash<std::optional<wasm::HeapType>_>,_std::equal_to<std::optional<wasm::HeapType>_>,_std::allocator<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>_>_>
  shapePartitions;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> newMergeable;
  _Storage<wasm::HeapType,_true> _Stack_d8;
  optional<wasm::HeapType> super;
  undefined1 local_c0 [8];
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  refinedPartitions;
  undefined1 auStack_88 [8];
  __buckets_alloc_type __alloc;
  allocator_type local_69;
  PassRunner *local_68;
  TypeMerging *local_60;
  _Storage<wasm::HeapType,_true> _Stack_58;
  HeapType type;
  
  local_210 = (undefined1  [8])local_210;
  partitions.
  super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_260 = (undefined1  [8])&typePartitions._M_h._M_rehash_policy._M_next_resize;
  typePartitions._M_h._M_buckets = (__buckets_ptr)0x1;
  typePartitions._M_h._M_bucket_count = 0;
  typePartitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  typePartitions._M_h._M_element_count._0_4_ = 0x3f800000;
  typePartitions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  typePartitions._M_h._M_rehash_policy._4_4_ = 0;
  typePartitions._M_h._M_rehash_policy._M_next_resize = 0;
  local_150 = (undefined1  [8])&shapePartitions._M_h._M_rehash_policy._M_next_resize;
  shapePartitions._M_h._M_buckets = (__buckets_ptr)0x1;
  shapePartitions._M_h._M_bucket_count = 0;
  shapePartitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  shapePartitions._M_h._M_element_count._0_4_ = 0x3f800000;
  shapePartitions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  shapePartitions._M_h._M_rehash_policy._4_4_ = 0;
  shapePartitions._M_h._M_rehash_policy._M_next_resize = 0;
  local_1e0 = (undefined1  [8])local_260;
  partitions.
  super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_210;
  ensurePartition.typePartitions =
       (unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
        *)local_210;
  ensurePartition.partitions = (Partitions *)this;
  refinedPartitions.
  super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = kind;
  mergeableSupertypesFirst
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&ensurePartition.this,this,
             &this->mergeable);
  partitions.
  super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  ._M_impl._M_node._M_size = (size_t)partitionIndices._M_h._M_buckets;
  local_68 = (PassRunner *)&this->privateTypes;
  pTVar13 = ensurePartition.this;
  do {
    if (pTVar13 ==
        (TypeMerging *)
        partitions.
        super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
        ._M_impl._M_node._M_size) {
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 &ensurePartition.this);
      std::
      vector<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>,std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>
      ::
      vector<std::move_iterator<std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>,void>
                ((vector<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>,std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>
                  *)&newPartitions.
                     super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (move_iterator<std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                  )local_210,
                 (move_iterator<std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                  )local_210,(allocator_type *)&shapePartitions._M_h._M_single_bucket);
      DFA::refinePartitions<wasm::HeapType>
                ((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                  *)local_c0,
                 (vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                  *)&newPartitions.
                     super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar9 = refinedPartitions.
               super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (refinedPartitions.
          super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == Supertypes) {
        type_1.id = 0;
        newPartitions.
        super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        newPartitions.
        super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        this_00 = &partitionIndices._M_h._M_single_bucket;
        auVar32 = local_c0;
        while (auVar32 != (undefined1  [8])pvVar9) {
          pHVar7 = (((_Vector_impl *)
                    &((_Hashtable *)&((PassRunner *)auVar32)->_vptr_PassRunner)->_M_buckets)->
                   super__Vector_impl_data)._M_start;
          local_68 = (PassRunner *)auVar32;
          if ((long)((PassRunner *)auVar32)->wasm - (long)pHVar7 == 8) {
            pp_Var3 = &shapePartitions._M_h._M_single_bucket;
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pp_Var3,
                       (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auVar32);
            __l._M_len = 1;
            __l._M_array = (iterator)pp_Var3;
            std::
            vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
            ::vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      *)&_Stack_58._M_value,__l,(allocator_type *)&ensurePartition.this);
            std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                      ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pp_Var3);
          }
          else {
            std::
            _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                      ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&shapePartitions._M_h._M_single_bucket,pHVar7,
                       ((PassRunner *)auVar32)->wasm,0,&ensurePartition.this,
                       (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_88,
                       &_Stack_d8);
            _Stack_58 = (_Storage<wasm::HeapType,_true>)0x0;
            type.id = 0;
            ensurePartition.this =
                 (TypeMerging *)&partitionIndices._M_h._M_rehash_policy._M_next_resize;
            partitionIndices._M_h._M_buckets = (__buckets_ptr)0x1;
            partitionIndices._M_h._M_bucket_count = 0;
            partitionIndices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            partitionIndices._M_h._M_element_count._0_4_ = 0x3f800000;
            partitionIndices._M_h._M_rehash_policy._M_max_load_factor = 0.0;
            partitionIndices._M_h._M_rehash_policy._4_4_ = 0;
            partitionIndices._M_h._M_rehash_policy._M_next_resize = 0;
            mergeableSupertypesFirst
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_88,this,
                       (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_68);
            pTVar13 = ___alloc;
            for (auVar32 = auStack_88; auVar32 != (undefined1  [8])pTVar13;
                auVar32 = (undefined1  [8])&(((TypeMerging *)auVar32)->super_Pass).runner) {
              partitionIndices._M_h._M_single_bucket =
                   (__node_base_ptr)(((TypeMerging *)auVar32)->super_Pass)._vptr_Pass;
              oVar40 = HeapType::getDeclaredSuperType((HeapType *)this_00);
              typePartitions._M_h._M_single_bucket =
                   oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::HeapType>._M_payload;
              super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
                   oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::HeapType>._M_engaged;
              if ((((undefined1  [16])
                    oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
                   (undefined1  [16])0x0) ||
                 (sVar14 = std::
                           _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           ::count((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                    *)&shapePartitions._M_h._M_single_bucket,
                                   (key_type *)&typePartitions._M_h._M_single_bucket), sVar14 == 0))
              {
                lVar28 = type.id - (long)_Stack_58;
                super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._8_8_ =
                     partitionIndices._M_h._M_single_bucket;
                __l_00._M_len = 1;
                __l_00._M_array =
                     (iterator)
                     &super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._M_engaged;
                std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                          ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                           &_Stack_d8._M_value,__l_00,&local_69);
                std::
                vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                ::emplace_back<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                          ((vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                            *)&_Stack_58._M_value,
                           (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                           &_Stack_d8._M_value);
                std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                          ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                           &_Stack_d8._M_value);
                pmVar27 = std::__detail::
                          _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&ensurePartition.this,(key_type *)this_00);
                *pmVar27 = (mapped_type)(lVar28 / 0x18);
              }
              else {
                pmVar27 = std::__detail::
                          _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::at((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&ensurePartition.this,
                               (key_type *)&typePartitions._M_h._M_single_bucket);
                uVar33 = *pmVar27;
                std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                          ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                           ((ulong)uVar33 * 0x18 + (long)_Stack_58),(value_type *)this_00);
                pmVar27 = std::__detail::
                          _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&ensurePartition.this,(key_type *)this_00);
                *pmVar27 = uVar33;
              }
            }
            std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                      ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_88);
            std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&ensurePartition.this);
            std::
            _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)&shapePartitions._M_h._M_single_bucket);
          }
          std::
          vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
          ::
          insert<__gnu_cxx::__normal_iterator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>*,std::vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>,void>
                    ((vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                      *)&type_1,
                     (const_iterator)
                     newPartitions.
                     super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                      )_Stack_58._M_value.id,
                     (__normal_iterator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                      )type.id);
          std::
          vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ::~vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     *)&_Stack_58._M_value);
          auVar32 = (undefined1  [8])&local_68->passes;
        }
        std::
        vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
        ::operator=((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     *)local_c0,
                    (vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     *)&type_1);
        std::
        vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
        ::~vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                   *)&type_1);
      }
      newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      shapePartitions._M_h._M_single_bucket = (__node_base_ptr)0x0;
      newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bVar10 = false;
      this_01 = &ensurePartition.this;
      auVar32 = local_c0;
      while (auVar32 !=
             (undefined1  [8])
             refinedPartitions.
             super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) {
        mergeableSupertypesFirst
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_01,this,
                   (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auVar32);
        auStack_88 = (undefined1  [8])((ensurePartition.this)->super_Pass)._vptr_Pass;
        std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                  ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_01);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   &shapePartitions._M_h._M_single_bucket,(value_type *)auStack_88);
        pp_Var8 = *(__buckets_ptr *)&((PassRunner *)auVar32)->wasm;
        local_68 = (PassRunner *)auVar32;
        for (pp_Var38 = ((_Hashtable *)&((PassRunner *)auVar32)->_vptr_PassRunner)->_M_buckets;
            pp_Var38 != pp_Var8; pp_Var38 = pp_Var38 + 1) {
          ensurePartition.this = (TypeMerging *)*pp_Var38;
          if ((undefined1  [8])ensurePartition.this != auStack_88) {
            pmVar29 = std::__detail::
                      _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this->merges,(key_type *)this_01);
            pmVar29->id = (uintptr_t)auStack_88;
            bVar10 = true;
          }
        }
        auVar32 = (undefined1  [8])&local_68->passes;
      }
      pp_Var3 = &shapePartitions._M_h._M_single_bucket;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_move_assign
                (&this->mergeable,pp_Var3);
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pp_Var3);
      std::
      vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
      ::~vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                 *)local_c0);
      std::
      vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
      ::~vector((vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                 *)&newPartitions.
                    super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      unordered_map<std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>,_std::hash<std::optional<wasm::HeapType>_>,_std::equal_to<std::optional<wasm::HeapType>_>,_std::allocator<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>_>_>
      ::~unordered_map((unordered_map<std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>,_std::hash<std::optional<wasm::HeapType>_>,_std::equal_to<std::optional<wasm::HeapType>_>,_std::allocator<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>_>_>
                        *)local_150);
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_260);
      std::__cxx11::
      _List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
      ::_M_clear((_List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                  *)local_210);
      return bVar10;
    }
    _Stack_d8._M_value.id = (HeapType)(pTVar13->super_Pass)._vptr_Pass;
    auStack_88 = (undefined1  [8])0x0;
    ___alloc = (TypeMerging *)0x0;
    _Stack_58._M_value.id = _Stack_d8._M_value.id;
    HeapType::getHeapTypeChildren
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &shapePartitions._M_h._M_single_bucket,&_Stack_d8._M_value);
    pHVar7 = newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (p_Var35 = shapePartitions._M_h._M_single_bucket; p_Var35 != (__node_base_ptr)pHVar7;
        p_Var35 = p_Var35 + 1) {
      newPartitions.
      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var35->_M_nxt;
      if (((pointer)0x7c <
           newPartitions.
           super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage) &&
         (sVar14 = std::
                   _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::count((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)local_68,
                           (key_type *)
                           &newPartitions.
                            super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage), sVar14 == 0)) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_88,
                   (value_type *)
                   &newPartitions.
                    super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &shapePartitions._M_h._M_single_bucket);
    pTVar1 = ___alloc;
    for (auVar32 = auStack_88; auVar32 != (undefined1  [8])pTVar1;
        auVar32 = (undefined1  [8])&(((TypeMerging *)auVar32)->super_Pass).runner) {
      merge::anon_class_24_3_64d2c6ff::operator()
                ((anon_class_24_3_64d2c6ff *)local_1e0,
                 (HeapType)(((TypeMerging *)auVar32)->super_Pass)._vptr_Pass);
    }
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_88);
    sVar15 = SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
             ::count(&(this->castTypes).
                      super_SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
                     ,&_Stack_58._M_value);
    if ((sVar15 != 0) ||
       (sVar14 = std::
                 _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)local_68,&_Stack_58._M_value), sVar14 == 0)) {
      merge::anon_class_24_3_64d2c6ff::operator()
                ((anon_class_24_3_64d2c6ff *)local_1e0,_Stack_58._M_value.id);
      goto LAB_00b8f1dd;
    }
    if (refinedPartitions.
        super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == Supertypes) {
      oVar40 = HeapType::getDeclaredSuperType(&_Stack_58._M_value);
      if ((((undefined1  [16])
            oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
           (undefined1  [16])0x0) ||
         (bVar10 = shapeEq(_Stack_58._M_value.id,
                           oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::HeapType>._M_payload._M_value),
         !bVar10)) {
        merge::anon_class_24_3_64d2c6ff::operator()
                  ((anon_class_24_3_64d2c6ff *)local_1e0,_Stack_58._M_value.id);
        goto LAB_00b8f1dd;
      }
      iVar19 = merge::anon_class_24_3_64d2c6ff::operator()
                         ((anon_class_24_3_64d2c6ff *)local_1e0,
                          oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
      pp_Var3 = &shapePartitions._M_h._M_single_bucket;
      makeDFAState((State<wasm::HeapType> *)pp_Var3,this,_Stack_58._M_value.id);
      std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>
      ::emplace_back<wasm::DFA::State<wasm::HeapType>>
                ((vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>
                  *)(iVar19._M_node + 1),(State<wasm::HeapType> *)pp_Var3);
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                (&newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>);
      pmVar20 = std::__detail::
                _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_260,&_Stack_58._M_value);
      goto LAB_00b8f95a;
    }
    type_1.id = (uintptr_t)_Stack_58._M_value.id;
    oVar40 = HeapType::getDeclaredSuperType(&type_1);
    _Stack_d8 = oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_payload;
    super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
         oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>._M_engaged;
    if ((((undefined1  [16])
          oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
         (undefined1  [16])0x0) &&
       (_Stack_d8._M_value = getMerged(this,_Stack_d8._M_value),
       super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ == '\0')) {
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = 1;
    }
    p_Var16 = (_Hash_node_base *)
              std::__optional_hash_call_base<wasm::HeapType,_wasm::HeapType,_true>::operator()
                        ((__optional_hash_call_base<wasm::HeapType,_wasm::HeapType,_true> *)
                         local_150,(optional<wasm::HeapType> *)&_Stack_d8._M_value);
    uVar34 = (ulong)p_Var16 % (ulong)shapePartitions._M_h._M_buckets;
    if (*(_Hash_node_base **)((long)local_150 + uVar34 * 8) != (_Hash_node_base *)0x0) {
      p_Var17 = (*(_Hash_node_base **)((long)local_150 + uVar34 * 8))->_M_nxt;
      p_Var39 = p_Var17[10]._M_nxt;
      do {
        if (p_Var39 == p_Var16) {
          if (super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ ==
              *(char *)&p_Var17[2]._M_nxt &&
              (~super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ & 1) == 0)
          {
            if (_Stack_d8 == *(_Storage<wasm::HeapType,_true> *)(p_Var17 + 1)) goto LAB_00b8f53a;
          }
          else if (super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ ==
                   *(char *)&p_Var17[2]._M_nxt) goto LAB_00b8f53a;
        }
        p_Var17 = p_Var17->_M_nxt;
      } while ((p_Var17 != (_Hash_node_base *)0x0) &&
              (p_Var39 = p_Var17[10]._M_nxt,
              (ulong)p_Var39 % (ulong)shapePartitions._M_h._M_buckets == uVar34));
    }
    shapePartitions._M_h._M_single_bucket = (__node_base_ptr)local_150;
    p_Var17 = (_Hash_node_base *)operator_new(0x58);
    p_Var17->_M_nxt = (_Hash_node_base *)0x0;
    p_Var17[1]._M_nxt = (_Hash_node_base *)_Stack_d8;
    p_Var17[2]._M_nxt =
         (_Hash_node_base *)
         CONCAT71(super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._1_7_,
                  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_);
    p_Var17[7]._M_nxt = (_Hash_node_base *)0x0;
    p_Var17[3]._M_nxt = p_Var17 + 9;
    p_Var17[4]._M_nxt = (_Hash_node_base *)0x1;
    p_Var17[5]._M_nxt = (_Hash_node_base *)0x0;
    p_Var17[6]._M_nxt = (_Hash_node_base *)0x0;
    *(undefined4 *)&p_Var17[7]._M_nxt = 0x3f800000;
    p_Var17[8]._M_nxt = (_Hash_node_base *)0x0;
    p_Var17[9]._M_nxt = (_Hash_node_base *)0x0;
    local_60 = (TypeMerging *)shapePartitions._M_h._M_rehash_policy._0_8_;
    newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)p_Var17;
    auVar41 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&shapePartitions._M_h._M_element_count,
                         (ulong)shapePartitions._M_h._M_buckets,
                         (ulong)shapePartitions._M_h._M_before_begin._M_nxt);
    __n = auVar41._8_8_;
    if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == (__buckets_ptr)0x1) {
        shapePartitions._M_h._M_rehash_policy._M_next_resize = 0;
        __s = &shapePartitions._M_h._M_rehash_policy._M_next_resize;
      }
      else {
        __s = (size_t *)
              std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::allocate
                        ((allocator_type *)auStack_88,(size_type)__n);
        memset(__s,0,(long)__n * 8);
      }
      _Var4._M_nxt = (_Hash_node_base *)shapePartitions._M_h._M_bucket_count;
      shapePartitions._M_h._M_bucket_count = 0;
      uVar34 = 0;
LAB_00b8f3b1:
      uVar37 = uVar34;
      _Var30._M_nxt = _Var4._M_nxt;
      if (_Var30._M_nxt != (_Hash_node_base *)0x0) {
        _Var4._M_nxt = (_Var30._M_nxt)->_M_nxt;
        uVar34 = (ulong)_Var30._M_nxt[10]._M_nxt % (ulong)__n;
        if ((_Hash_node_base *)__s[uVar34] == (_Hash_node_base *)0x0) break;
        (_Var30._M_nxt)->_M_nxt = ((_Hash_node_base *)__s[uVar34])->_M_nxt;
        psVar18 = (size_t *)__s[uVar34];
        uVar34 = uVar37;
        goto LAB_00b8f40a;
      }
      std::
      _Hashtable<std::optional<wasm::HeapType>,_std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>,_std::allocator<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::optional<wasm::HeapType>_>,_std::hash<std::optional<wasm::HeapType>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_deallocate_buckets
                ((_Hashtable<std::optional<wasm::HeapType>,_std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>,_std::allocator<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::optional<wasm::HeapType>_>,_std::hash<std::optional<wasm::HeapType>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_150);
      shapePartitions._M_h._M_buckets = __n;
      local_150 = (undefined1  [8])__s;
      uVar34 = (ulong)p_Var16 % (ulong)__n;
    }
    p_Var17[10]._M_nxt = p_Var16;
    if (*(_Hash_node_base **)((long)local_150 + uVar34 * 8) == (_Hash_node_base *)0x0) {
      p_Var17->_M_nxt = (_Hash_node_base *)shapePartitions._M_h._M_bucket_count;
      if (shapePartitions._M_h._M_bucket_count != 0) {
        *(_Hash_node_base **)
         ((long)local_150 +
         (*(ulong *)(shapePartitions._M_h._M_bucket_count + 0x50) %
         (ulong)shapePartitions._M_h._M_buckets) * 8) = p_Var17;
      }
      *(size_type **)((long)local_150 + uVar34 * 8) = &shapePartitions._M_h._M_bucket_count;
      shapePartitions._M_h._M_bucket_count = (size_type)p_Var17;
    }
    else {
      p_Var17->_M_nxt = (*(_Hash_node_base **)((long)local_150 + uVar34 * 8))->_M_nxt;
      (*(_Hash_node_base **)((long)local_150 + uVar34 * 8))->_M_nxt = p_Var17;
    }
    shapePartitions._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)((long)&(shapePartitions._M_h._M_before_begin._M_nxt)->_M_nxt + 1);
    newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::
    _Hashtable<std::optional<wasm::HeapType>,_std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>,_std::allocator<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::optional<wasm::HeapType>_>,_std::hash<std::optional<wasm::HeapType>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Scoped_node::~_Scoped_node((_Scoped_node *)&shapePartitions._M_h._M_single_bucket);
LAB_00b8f53a:
    pTVar1 = (TypeMerging *)(p_Var17 + 3);
    newPartitions.
    super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)type_1.id;
    auStack_88 = (undefined1  [8])pTVar1;
    pTVar21 = (TypeMerging *)
              std::__detail::
              _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>,true>>>
              ::
              _M_allocate_node<std::pair<wasm::HeapType_const,std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>>
                        ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>,true>>>
                          *)pTVar1,
                         (pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                          *)&newPartitions.
                             super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_c0 = (undefined1  [8])(pTVar21->super_Pass).runner;
    ___alloc = pTVar21;
    bVar10 = HeapType::isOpen((HeapType *)local_c0);
    bVar11 = HeapType::isShared((HeapType *)local_c0);
    HVar12 = HeapType::getKind((HeapType *)local_c0);
    switch(HVar12) {
    case Func:
      local_60 = pTVar21;
      SVar42 = HeapType::getSignature((HeapType *)local_c0);
      sVar15 = shapeHash(SVar42.params.id);
      sVar24 = shapeHash(SVar42.results.id);
      sVar15 = (sVar15 >> 4) + sVar24 + sVar15 * 0x1000 + -0x61c8864680b583eb ^ sVar15;
      break;
    case Struct:
      local_60 = pTVar21;
      pSVar22 = HeapType::getStruct((HeapType *)local_c0);
      pFVar23 = (pSVar22->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pFVar31 = (pSVar22->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      sVar15 = (long)pFVar31 - (long)pFVar23 >> 4;
      lVar28 = 8;
      uVar34 = extraout_RDX;
      for (uVar37 = 0; uVar37 < (ulong)((long)pFVar31 - (long)pFVar23 >> 4); uVar37 = uVar37 + 1) {
        a_00.packedType = (int)uVar34;
        a_00.mutable_ = (int)(uVar34 >> 0x20);
        a_00.type.id = *(uintptr_t *)((long)&(pFVar23->type).id + lVar28);
        sVar24 = shapeHash(*(anon_unknown_0 **)((long)pFVar23 + lVar28 + -8),a_00);
        uVar34 = sVar15 >> 4;
        sVar15 = sVar15 ^ sVar15 * 0x1000 + -0x61c8864680b583eb + uVar34 + sVar24;
        pFVar23 = (pSVar22->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar31 = (pSVar22->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        lVar28 = lVar28 + 0x10;
      }
      break;
    case Array:
      local_60 = pTVar21;
      AVar43 = HeapType::getArray((HeapType *)&shapePartitions._M_h._M_single_bucket);
      a._8_8_ = AVar43.element._8_8_;
      a.type.id = (uintptr_t)
                  newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      sVar15 = shapeHash((anon_unknown_0 *)shapePartitions._M_h._M_single_bucket,a);
      break;
    case Cont:
      uVar33 = 0x255;
      msg = "TODO: cont";
      local_60 = pTVar21;
      goto LAB_00b8fd92;
    default:
      uVar33 = 0x259;
      msg = "unexpected kind";
LAB_00b8fd92:
      handle_unreachable(msg,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp"
                         ,uVar33);
    }
    lVar28 = -0x61c8864680b583ea;
    if (!bVar11) {
      lVar28 = -0x61c8864680b583eb;
    }
    uVar37 = (ulong)bVar10 * 0x1000 + lVar28;
    uVar34 = bVar10 ^ uVar37;
    uVar34 = (uVar37 >> 4) + 0x9e3779b97f4a7c15 + uVar34 * 0x1000 + (long)(int)HVar12 ^ uVar34;
    p_Var39 = (_Hash_node_base *)
              (uVar34 * 0x1000 + -0x61c8864680b583eb + (uVar34 >> 4) + sVar15 ^ uVar34);
    uVar34 = (ulong)p_Var39 % (ulong)p_Var17[4]._M_nxt;
    p_Var16 = p_Var17[3]._M_nxt[uVar34]._M_nxt;
    if (p_Var16 != (_Hash_node_base *)0x0) {
      p_Var25 = p_Var16->_M_nxt[3]._M_nxt;
      p_Var5 = p_Var16->_M_nxt;
      while ((p_Var36 = p_Var5, p_Var25 != p_Var39 ||
             (bVar10 = shapeEq((HeapType)(local_60->super_Pass).runner,(HeapType)p_Var36[1]._M_nxt),
             !bVar10))) {
        p_Var5 = p_Var36->_M_nxt;
        if ((p_Var5 == (_Hash_node_base *)0x0) ||
           (p_Var25 = p_Var5[3]._M_nxt, p_Var16 = p_Var36,
           (ulong)p_Var25 % (ulong)p_Var17[4]._M_nxt != uVar34)) goto LAB_00b8f787;
      }
      if ((TypeMerging *)p_Var16->_M_nxt != (TypeMerging *)0x0) {
        bVar10 = false;
        local_60 = (TypeMerging *)p_Var16->_M_nxt;
        goto LAB_00b8f8be;
      }
    }
LAB_00b8f787:
    auVar41 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)(p_Var17 + 7),(ulong)p_Var17[4]._M_nxt,(ulong)p_Var17[6]._M_nxt);
    p_Var16 = auVar41._8_8_;
    if ((auVar41 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      p_Var25 = (_Hash_node_base *)(pTVar1->super_Pass)._vptr_Pass;
    }
    else {
      if (p_Var16 == (_Hash_node_base *)0x1) {
        p_Var25 = p_Var17 + 9;
        p_Var17[9]._M_nxt = (_Hash_node_base *)0x0;
      }
      else {
        p_Var25 = (_Hash_node_base *)
                  std::__detail::
                  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_true>_>_>
                  ::_M_allocate_buckets
                            ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_true>_>_>
                              *)pTVar1,(size_t)p_Var16);
      }
      p_Var2 = p_Var17 + 5;
      p_Var5 = p_Var17[5]._M_nxt;
      p_Var17[5]._M_nxt = (_Hash_node_base *)0x0;
      uVar34 = 0;
LAB_00b8f7df:
      p_Var36 = p_Var5;
      uVar37 = uVar34;
      if (p_Var36 != (_Hash_node_base *)0x0) {
        p_Var5 = p_Var36->_M_nxt;
        uVar34 = (ulong)p_Var36[3]._M_nxt % (ulong)p_Var16;
        if (p_Var25[uVar34]._M_nxt == (__node_base_ptr)0x0) goto LAB_00b8f80e;
        p_Var36->_M_nxt = (p_Var25[uVar34]._M_nxt)->_M_nxt;
        p_Var26 = p_Var25[uVar34]._M_nxt;
        uVar34 = uVar37;
        goto LAB_00b8f825;
      }
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_wasm::(anonymous_namespace)::ShapeEq,_wasm::(anonymous_namespace)::ShapeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_deallocate_buckets
                ((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_wasm::(anonymous_namespace)::ShapeEq,_wasm::(anonymous_namespace)::ShapeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)pTVar1);
      p_Var17[4]._M_nxt = p_Var16;
      p_Var17[3]._M_nxt = p_Var25;
      uVar34 = (ulong)p_Var39 % (ulong)p_Var16;
    }
    (local_60->super_Pass).name._M_string_length = (size_type)p_Var39;
    if (p_Var25[uVar34]._M_nxt == (__node_base_ptr)0x0) {
      (local_60->super_Pass)._vptr_Pass = (_func_int **)p_Var17[5]._M_nxt;
      p_Var17[5]._M_nxt = (_Hash_node_base *)local_60;
      pp_Var6 = (__buckets_ptr)(local_60->super_Pass)._vptr_Pass;
      if (pp_Var6 != (__buckets_ptr)0x0) {
        p_Var25[(ulong)pp_Var6[3] % (ulong)p_Var17[4]._M_nxt]._M_nxt = (_Hash_node_base *)local_60;
        p_Var25 = p_Var17[3]._M_nxt;
      }
      p_Var25[uVar34]._M_nxt = p_Var17 + 5;
    }
    else {
      (local_60->super_Pass)._vptr_Pass = (_func_int **)(p_Var25[uVar34]._M_nxt)->_M_nxt;
      (p_Var25[uVar34]._M_nxt)->_M_nxt = (_Hash_node_base *)local_60;
    }
    p_Var17[6]._M_nxt = (_Hash_node_base *)((long)&(p_Var17[6]._M_nxt)->_M_nxt + 1);
    ___alloc = (TypeMerging *)0x0;
    bVar10 = true;
LAB_00b8f8be:
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_wasm::(anonymous_namespace)::ShapeEq,_wasm::(anonymous_namespace)::ShapeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Scoped_node::~_Scoped_node((_Scoped_node *)auStack_88);
    if (bVar10) {
      shapePartitions._M_h._M_single_bucket = (__node_base_ptr)0x0;
      newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pp_Var3 = &shapePartitions._M_h._M_single_bucket;
      iVar19 = std::__cxx11::
               list<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>,std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>
               ::
               emplace<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>
                         ((list<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>,std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>
                           *)local_210,(const_iterator)local_210,
                          (vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
                           *)pp_Var3);
      (local_60->super_Pass).name._M_dataplus._M_p = (pointer)iVar19._M_node;
      std::
      vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>::
      ~vector((vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
               *)pp_Var3);
    }
    iVar19._M_node = (_List_node_base *)(local_60->super_Pass).name._M_dataplus._M_p;
    pp_Var3 = &shapePartitions._M_h._M_single_bucket;
    makeDFAState((State<wasm::HeapType> *)pp_Var3,this,_Stack_58._M_value.id);
    std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>::
    emplace_back<wasm::DFA::State<wasm::HeapType>>
              ((vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>
                *)(iVar19._M_node + 1),(State<wasm::HeapType> *)pp_Var3);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              (&newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>);
    pmVar20 = std::__detail::
              _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)local_260,&_Stack_58._M_value);
LAB_00b8f95a:
    pmVar20->_M_node = iVar19._M_node;
LAB_00b8f1dd:
    pTVar13 = (TypeMerging *)&(pTVar13->super_Pass).runner;
  } while( true );
  (_Var30._M_nxt)->_M_nxt = (_Hash_node_base *)shapePartitions._M_h._M_bucket_count;
  shapePartitions._M_h._M_bucket_count = (size_type)_Var30._M_nxt;
  __s[uVar34] = (size_t)&shapePartitions._M_h._M_bucket_count;
  if ((_Var30._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    psVar18 = __s + uVar37;
LAB_00b8f40a:
    *psVar18 = (size_t)_Var30._M_nxt;
  }
  goto LAB_00b8f3b1;
LAB_00b8f80e:
  p_Var36->_M_nxt = p_Var2->_M_nxt;
  p_Var2->_M_nxt = p_Var36;
  p_Var25[uVar34]._M_nxt = p_Var2;
  if (p_Var36->_M_nxt != (_Hash_node_base *)0x0) {
    p_Var26 = p_Var25 + uVar37;
LAB_00b8f825:
    p_Var26->_M_nxt = p_Var36;
  }
  goto LAB_00b8f7df;
}

Assistant:

bool TypeMerging::merge(MergeKind kind) {
  // Initial partitions are formed by grouping types with their structurally
  // similar supertypes or siblings, according to the `kind`.
  Partitions partitions;

#if TYPE_MERGING_DEBUG
  auto printedPrivateTypes = ModuleUtils::getPrivateHeapTypes(*module);
  using Fallback = IndexedTypeNameGenerator<DefaultTypeNameGenerator>;
  Fallback printPrivate(printedPrivateTypes, "private.");
  ModuleTypeNameGenerator<Fallback> print(*module, printPrivate);
  auto dumpPartitions = [&]() {
    size_t i = 0;
    for (auto& partition : partitions) {
      std::cerr << i++ << ": " << print(partition[0].val) << "\n";
      for (size_t j = 1; j < partition.size(); ++j) {
        std::cerr << "   " << print(partition[j].val) << "\n";
      }
      std::cerr << "\n";
    }
  };

#endif // TYPE_MERGING_DEBUG

  // Map each type to its partition in the list.
  std::unordered_map<HeapType, Partitions::iterator> typePartitions;

  // Map the supertypes and top-level structures of each type to partitions so
  // that siblings that refine the supertype in the same way can be assigned to
  // the same partition and potentially merged.
  std::unordered_map<
    std::optional<HeapType>,
    std::unordered_map<HeapType, Partitions::iterator, ShapeHash, ShapeEq>>
    shapePartitions;

  // Ensure the type has a partition and return a reference to it. Since we
  // merge up the type tree and visit supertypes first, the partition usually
  // already exists. The exception is when the supertype is public, in which
  // case we might not have created a partition for it yet.
  auto ensurePartition = [&](HeapType type) -> Partitions::iterator {
    auto [it, inserted] = typePartitions.insert({type, partitions.end()});
    if (inserted) {
      it->second = partitions.insert(partitions.end(), {makeDFAState(type)});
    }
    return it->second;
  };

  // Similar to the above, but look up or create a partition associated with the
  // type's supertype and top-level shape rather than its identity.
  auto ensureShapePartition = [&](HeapType type) -> Partitions::iterator {
    auto super = type.getDeclaredSuperType();
    if (super) {
      super = getMerged(*super);
    }
    auto [it, inserted] =
      shapePartitions[super].insert({type, partitions.end()});
    if (inserted) {
      it->second = partitions.insert(partitions.end(), Partition{});
    }
    return it->second;
  };

  // For each type, either create a new partition or add to its supertype's
  // partition.
  for (auto type : mergeableSupertypesFirst(mergeable)) {
    // We need partitions for any public children of this type since those
    // children will participate in the DFA we're creating.
    for (auto child : getPublicChildren(type)) {
      ensurePartition(child);
    }
    // If the type is distinguished by the module or public, we cannot merge it,
    // so create a new partition for it.
    if (castTypes.count(type) || !privateTypes.count(type)) {
      ensurePartition(type);
      continue;
    }

    switch (kind) {
      case Supertypes: {
        auto super = type.getDeclaredSuperType();
        if (super && shapeEq(type, *super)) {
          // The current type and its supertype have the same top-level
          // structure and are not distinguished, so add the current type to its
          // supertype's partition.
          auto it = ensurePartition(*super);
          it->push_back(makeDFAState(type));
          typePartitions[type] = it;
        } else {
          // Otherwise, create a new partition for this type.
          ensurePartition(type);
        }
        break;
      }
      case Siblings: {
        // Find or create a partition for this type's siblings of the same
        // shape.
        auto it = ensureShapePartition(type);
        it->push_back(makeDFAState(type));
        typePartitions[type] = it;
        break;
      }
    }
  }

#if TYPE_MERGING_DEBUG
  std::cerr << "Initial partitions (";
  switch (kind) {
    case Supertypes:
      std::cerr << "supertypes";
      break;
    case Siblings:
      std::cerr << "siblings";
      break;
  }
  std::cerr << "):\n";
  dumpPartitions();
#endif

  // Construct and refine the partitioned DFA.
  std::vector<Partition> dfa(std::make_move_iterator(partitions.begin()),
                             std::make_move_iterator(partitions.end()));
  auto refinedPartitions = DFA::refinePartitions(dfa);

#if TYPE_MERGING_DEBUG
  auto dumpRefinedPartitions = [&]() {
    size_t i = 0;
    for (auto& partition : refinedPartitions) {
      std::cerr << i++ << ": " << print(partition[0]) << "\n";
      for (size_t j = 1; j < partition.size(); ++j) {
        std::cerr << "   " << print(partition[j]) << "\n";
      }
      std::cerr << "\n";
    }
  };
  std::cerr << "Refined partitions:\n";
  dumpRefinedPartitions();
#endif

  if (kind == Supertypes) {
    // It's possible that a partition has been split such that a common ancestor
    // ended up in one of the new partitions, leaving unrelated types grouped
    // together in the other new partition. Since we are only supposed to be
    // merging types into their supertypes, merging such unrelated types would
    // be unsafe. Post-process the refined partitions to manually split any
    // partitions containing unrelated types.
    //
    // Normally splitting partitions like this would require re-running DFA
    // minimization afterward, but in this case it is not possible that the
    // manual splits cause types in any other partition to become
    // differentiatable. A type and its subtype cannot differ by referring to
    // different, unrelated types in the same position because then they would
    // not be in a valid subtype relationship.
    std::vector<std::vector<HeapType>> newPartitions;
    for (const auto& partitionTypes : refinedPartitions) {
      auto split = splitSupertypePartition(partitionTypes);
      newPartitions.insert(newPartitions.end(), split.begin(), split.end());
    }
    refinedPartitions = newPartitions;

#if TYPE_MERGING_DEBUG
    std::cerr << "Manually split partitions:\n";
    dumpRefinedPartitions();
#endif
  }

  // Merge each refined partition into a single type. We should only merge into
  // supertypes or siblings because if we try to merge into a subtype then we
  // will accidentally set that subtype to be its own supertype. Also keep track
  // of the remaining types.
  std::vector<HeapType> newMergeable;
  bool merged = false;
  for (const auto& partition : refinedPartitions) {
    auto target = mergeableSupertypesFirst(partition).front();
    newMergeable.push_back(target);
    for (auto type : partition) {
      if (type != target) {
        merges[type] = target;
        merged = true;
      }
    }
  }
  mergeable = std::move(newMergeable);

#if TYPE_MERGING_DEBUG
  std::cerr << "Merges:\n";
  std::unordered_map<HeapType, std::vector<HeapType>> mergees;
  for (auto& [mergee, target] : merges) {
    mergees[target].push_back(mergee);
  }
  for (auto& [target, types] : mergees) {
    std::cerr << "target: " << print(target) << "\n";
    for (auto type : types) {
      std::cerr << "  " << print(type) << "\n";
    }
    std::cerr << "\n";
  }
#endif // TYPE_MERGING_DEBUG

  return merged;
}